

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::GatherBase::VerifyCompute(GatherBase *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  Vec4 *c0;
  float *pfVar9;
  Vector<float,_4> local_70;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  Vec4 local_30;
  Vec4 *local_20;
  Vec4 *data;
  GatherBase *this_local;
  
  data = (Vec4 *)this;
  c0 = (Vec4 *)glu::CallLogWrapper::glMapBufferRange
                         (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper,0x90d2,0,0x10,1);
  local_20 = c0;
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(&local_30);
  bVar8 = TGBase::ColorEqual(&this->super_TGBase,c0,&local_30,&(this->super_TGBase).g_color_eps);
  if (((bVar8 ^ 0xffU) & 1) == 0) {
    this_local = (GatherBase *)0x0;
  }
  else {
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(&local_40);
    pfVar9 = tcu::Vector<float,_4>::x(&local_40);
    fVar1 = *pfVar9;
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(&local_50);
    pfVar9 = tcu::Vector<float,_4>::y(&local_50);
    fVar2 = *pfVar9;
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(&local_60);
    pfVar9 = tcu::Vector<float,_4>::z(&local_60);
    fVar3 = *pfVar9;
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(&local_70);
    pfVar9 = tcu::Vector<float,_4>::w(&local_70);
    fVar4 = *pfVar9;
    pfVar9 = tcu::Vector<float,_4>::x(local_20);
    fVar5 = *pfVar9;
    pfVar9 = tcu::Vector<float,_4>::y(local_20);
    fVar6 = *pfVar9;
    pfVar9 = tcu::Vector<float,_4>::z(local_20);
    fVar7 = *pfVar9;
    pfVar9 = tcu::Vector<float,_4>::w(local_20);
    anon_unknown_0::Output
              ("Expected %f, %f, %f, %f, got: %f, %f, %f, %f, epsilon: %f, %f, %f, %f",(double)fVar1
               ,(double)fVar2,(double)fVar3,(double)fVar4,(double)fVar5,(double)fVar6,(double)fVar7,
               (double)*pfVar9);
    this_local = (GatherBase *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long VerifyCompute()
	{
		Vec4* data;
		data = static_cast<Vec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(Vec4), GL_MAP_READ_BIT));
		if (!ColorEqual(data[0], Expected(), g_color_eps))
		{ // for unorms
			Output("Expected %f, %f, %f, %f, got: %f, %f, %f, %f, epsilon: %f, %f, %f, %f", Expected().x(),
				   Expected().y(), Expected().z(), Expected().w(), data[0].x(), data[0].y(), data[0].z(), data[0].w());
			return ERROR;
		}
		return NO_ERROR;
	}